

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall f8n::runtime::MessageQueue::~MessageQueue(MessageQueue *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_IMessageQueue)._vptr_IMessageQueue = (_func_int **)&PTR__MessageQueue_002168f0;
  std::_V2::condition_variable_any::~condition_variable_any(&this->waitForDispatch);
  std::
  _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
  ::~_Rb_tree(&(this->targets)._M_t);
  std::
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  ::~_Rb_tree(&(this->receivers)._M_t);
  p_Var2 = (this->dispatch).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->dispatch) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  p_Var2 = (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->queue) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

MessageQueue::~MessageQueue() {

}